

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangleQuadrature.hpp
# Opt level: O3

RectMatrix<double,_3U,_3U> *
OpenMD::TriangleQuadrature<OpenMD::RectMatrix<double,_3U,_3U>,_double>::Integrate
          (RectMatrix<double,_3U,_3U> *__return_storage_ptr__,
          function<OpenMD::RectMatrix<double,_3U,_3U>_(const_OpenMD::Vector<double,_2U>_&)> *f,
          TriangleQuadratureRule *rule,double *area)

{
  double dVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 *puVar5;
  double (*padVar6) [3];
  double *pdVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  RectMatrix<double,_3U,_3U> result_1;
  RectMatrix<double,_3U,_3U> integral;
  double local_118;
  double dStack_110;
  double local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  double local_78 [9];
  long *plVar4;
  
  iVar2 = (*rule->_vptr_TriangleQuadratureRule[3])(rule);
  iVar3 = (*rule->_vptr_TriangleQuadratureRule[4])();
  plVar4 = (long *)CONCAT44(extraout_var_00,iVar3);
  if ((f->super__Function_base)._M_manager != (_Manager_type)0x0) {
    padVar6 = (double (*) [3])&local_118;
    rule = (TriangleQuadratureRule *)padVar6;
    (*f->_M_invoker)((RectMatrix<double,_3U,_3U> *)padVar6,(_Any_data *)f,
                     *(Vector<double,_2U> **)CONCAT44(extraout_var,iVar2));
    pdVar7 = (double *)*plVar4;
    dVar1 = *pdVar7;
    puVar5 = &local_c8;
    local_98 = 0;
    uStack_90 = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    local_b8 = 0;
    uStack_b0 = 0;
    local_c8 = 0;
    uStack_c0 = 0;
    local_88 = 0;
    lVar8 = 0;
    do {
      lVar9 = 0;
      do {
        puVar5[lVar9] = (*(double (*) [3])*padVar6)[lVar9] * dVar1;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 3);
      lVar8 = lVar8 + 1;
      puVar5 = puVar5 + 3;
      padVar6 = padVar6 + 1;
    } while (lVar8 != 3);
    if (1 < (int)((ulong)(plVar4[1] - (long)pdVar7) >> 3)) {
      lVar8 = 1;
      do {
        if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0017535e;
        (*f->_M_invoker)((RectMatrix<double,_3U,_3U> *)local_78,(_Any_data *)f,
                         (Vector<double,_2U> *)
                         (lVar8 * 0x10 + *(long *)CONCAT44(extraout_var,iVar2)));
        lVar9 = *plVar4;
        dVar1 = *(double *)(lVar9 + lVar8 * 8);
        local_e8 = 0;
        uStack_e0 = 0;
        local_f8 = 0;
        uStack_f0 = 0;
        local_108 = 0.0;
        uStack_100 = 0;
        local_118 = 0.0;
        dStack_110 = 0.0;
        local_d8 = 0;
        lVar10 = 0;
        padVar6 = (double (*) [3])local_78;
        pdVar7 = &local_118;
        do {
          lVar11 = 0;
          do {
            pdVar7[lVar11] = (*(double (*) [3])*padVar6)[lVar11] * dVar1;
            lVar11 = lVar11 + 1;
          } while (lVar11 != 3);
          lVar10 = lVar10 + 1;
          pdVar7 = pdVar7 + 3;
          padVar6 = padVar6 + 1;
        } while (lVar10 != 3);
        puVar5 = &local_c8;
        lVar10 = 0;
        pdVar7 = &local_118;
        do {
          lVar11 = 0;
          do {
            puVar5[lVar11] = pdVar7[lVar11] + (double)puVar5[lVar11];
            lVar11 = lVar11 + 1;
          } while (lVar11 != 3);
          lVar10 = lVar10 + 1;
          puVar5 = puVar5 + 3;
          pdVar7 = pdVar7 + 3;
        } while (lVar10 != 3);
        lVar8 = lVar8 + 1;
        rule = (TriangleQuadratureRule *)0x3;
      } while (lVar8 < (int)((ulong)(plVar4[1] - lVar9) >> 3));
    }
    dVar1 = *area;
    __return_storage_ptr__->data_[2][0] = 0.0;
    __return_storage_ptr__->data_[2][1] = 0.0;
    __return_storage_ptr__->data_[1][1] = 0.0;
    __return_storage_ptr__->data_[1][2] = 0.0;
    __return_storage_ptr__->data_[0][2] = 0.0;
    __return_storage_ptr__->data_[1][0] = 0.0;
    __return_storage_ptr__->data_[0][0] = 0.0;
    __return_storage_ptr__->data_[0][1] = 0.0;
    __return_storage_ptr__->data_[2][2] = 0.0;
    puVar5 = &local_c8;
    lVar8 = 0;
    padVar6 = (double (*) [3])__return_storage_ptr__;
    do {
      lVar9 = 0;
      do {
        (*(double (*) [3])*padVar6)[lVar9] = (double)puVar5[lVar9] * dVar1;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 3);
      lVar8 = lVar8 + 1;
      padVar6 = padVar6 + 1;
      puVar5 = puVar5 + 3;
    } while (lVar8 != 3);
    return __return_storage_ptr__;
  }
LAB_0017535e:
  std::__throw_bad_function_call();
  std::
  __invoke_impl<OpenMD::RectMatrix<double,3u,3u>,OpenMD::TriangleQuadrature<OpenMD::RectMatrix<double,3u,3u>,double>::Integrate(std::function<OpenMD::RectMatrix<double,3u,3u>(OpenMD::Vector<double,3u>const&)>const&,OpenMD::TriangleQuadratureRule_const&,double_const&)::_lambda(OpenMD::Vector<double,2u>const&)_1_&,OpenMD::Vector<double,2u>const&>
            ();
  return (RectMatrix<double,_3U,_3U> *)rule;
}

Assistant:

NumericReturnType TriangleQuadrature<NumericReturnType, T>::Integrate(
      const std::function<NumericReturnType(const Vector<T, 2>&)>& f,
      const TriangleQuadratureRule& rule, const T& area) {
    // Get the quadrature points and weights.
    const std::vector<Vector2<T>>& barycentric_coordinates =
        rule.quadrature_points();
    const std::vector<T>& weights = rule.weights();
    assert(barycentric_coordinates.size() == weights.size());
    assert(weights.size() >= 1);

    // Sum the weighted function evaluated at the transformed
    // quadrature points.  The looping is done in this particular way
    // so that the return type can be either a traditional scalar
    // (e.g., `double`), a Vector, or some other numeric type,
    // without having to worry about the numerous possible ways to
    // initialize to zero (e.g., `double integral = 0.0` vs.
    // VectorXd = VectorXd:zZero())` or having to know
    // the dimension of the NumericReturnType (i.e., scalar or vector
    // dimension).
    NumericReturnType integral = f(barycentric_coordinates[0]) * weights[0];
    for (int i = 1; i < static_cast<int>(weights.size()); ++i)
      integral += f(barycentric_coordinates[i]) * weights[i];

    return integral * area;
  }